

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

LY_ERR lyd_validate_node_ext(lyd_node *node,ly_set *ext_node)

{
  lysc_ext_instance *plVar1;
  LY_ERR LVar2;
  long *object;
  ly_ctx *local_58;
  void *local_50;
  void *pvStack_38;
  LY_ERR ret__;
  uint64_t u;
  lysc_ext_instance *exts;
  lyd_ctx_ext_node *ext_n;
  ly_set *ext_node_local;
  lyd_node *node_local;
  
  plVar1 = node->schema->exts;
  pvStack_38 = (void *)0x0;
  do {
    if (plVar1 == (lysc_ext_instance *)0x0) {
      local_50 = (void *)0x0;
    }
    else {
      local_50 = plVar1[-1].compiled;
    }
    if (local_50 <= pvStack_38) {
      return LY_SUCCESS;
    }
    if (((plVar1[(long)pvStack_38].def)->plugin != (lyplg_ext *)0x0) &&
       ((plVar1[(long)pvStack_38].def)->plugin->node != (lyplg_ext_data_node_clb)0x0)) {
      object = (long *)malloc(0x10);
      if (object == (long *)0x0) {
        if (node->schema == (lysc_node *)0x0) {
          local_58 = (ly_ctx *)node[2].schema;
        }
        else {
          local_58 = node->schema->module->ctx;
        }
        ly_log(local_58,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_validate_node_ext")
        ;
        return LY_EMEM;
      }
      *object = (long)(plVar1 + (long)pvStack_38);
      object[1] = (long)node;
      LVar2 = ly_set_add(ext_node,object,'\x01',(uint32_t *)0x0);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
    }
    pvStack_38 = (void *)((long)pvStack_38 + 1);
  } while( true );
}

Assistant:

LY_ERR
lyd_validate_node_ext(struct lyd_node *node, struct ly_set *ext_node)
{
    struct lyd_ctx_ext_node *ext_n;
    struct lysc_ext_instance *exts;
    LY_ARRAY_COUNT_TYPE u;

    /* try to find a relevant extension instance with node callback */
    exts = node->schema->exts;
    LY_ARRAY_FOR(exts, u) {
        if (exts[u].def->plugin && exts[u].def->plugin->node) {
            /* store for validation */
            ext_n = malloc(sizeof *ext_n);
            LY_CHECK_ERR_RET(!ext_n, LOGMEM(LYD_CTX(node)), LY_EMEM);
            ext_n->ext = &exts[u];
            ext_n->node = node;
            LY_CHECK_RET(ly_set_add(ext_node, ext_n, 1, NULL));
        }
    }

    return LY_SUCCESS;
}